

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

ChCoordsys<double> * __thiscall
chrono::collision::ChCollisionModelBullet::GetShapePos
          (ChCoordsys<double> *__return_storage_ptr__,ChCollisionModelBullet *this,int index)

{
  float fVar1;
  float fVar2;
  element_type *peVar3;
  cbtCompoundShapeChild *pcVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  cbtQuaternion q;
  cbtQuaternion local_30;
  
  peVar3 = (this->bt_compound_shape).
           super___shared_ptr<cbtCompoundShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    if ((long)(this->super_ChCollisionModel).m_shapes.
              super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->super_ChCollisionModel).m_shapes.
              super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("m_shapes.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionModelBullet.cpp"
                    ,0x35f,
                    "virtual ChCoordsys<> chrono::collision::ChCollisionModelBullet::GetShapePos(int) const"
                   );
    }
    if (index != 0) {
      __assert_fail("index == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionModelBullet.cpp"
                    ,0x360,
                    "virtual ChCoordsys<> chrono::collision::ChCollisionModelBullet::GetShapePos(int) const"
                   );
    }
    (__return_storage_ptr__->pos).m_data[0] = 0.0;
    (__return_storage_ptr__->pos).m_data[1] = 0.0;
    (__return_storage_ptr__->pos).m_data[2] = 0.0;
    (__return_storage_ptr__->rot).m_data[0] = 1.0;
    (__return_storage_ptr__->rot).m_data[1] = 0.0;
    (__return_storage_ptr__->rot).m_data[2] = 0.0;
    (__return_storage_ptr__->rot).m_data[3] = 0.0;
  }
  else {
    (__return_storage_ptr__->pos).m_data[0] = 0.0;
    (__return_storage_ptr__->pos).m_data[1] = 0.0;
    (__return_storage_ptr__->pos).m_data[2] = 0.0;
    (__return_storage_ptr__->rot).m_data[0] = 1.0;
    (__return_storage_ptr__->rot).m_data[1] = 0.0;
    (__return_storage_ptr__->rot).m_data[2] = 0.0;
    (__return_storage_ptr__->rot).m_data[3] = 0.0;
    pcVar4 = (peVar3->m_children).m_data;
    cbtMatrix3x3::getRotation((cbtMatrix3x3 *)(pcVar4 + index),&local_30);
    auVar5._8_8_ = 0;
    auVar5._0_4_ = local_30.super_cbtQuadWord.m_floats[0];
    auVar5._4_4_ = local_30.super_cbtQuadWord.m_floats[1];
    auVar6._8_8_ = 0;
    auVar6._0_4_ = local_30.super_cbtQuadWord.m_floats[2];
    auVar6._4_4_ = local_30.super_cbtQuadWord.m_floats[3];
    fVar1 = pcVar4[index].m_transform.m_origin.m_floats[2];
    fVar2 = pcVar4[index].m_transform.m_origin.m_floats[1];
    (__return_storage_ptr__->pos).m_data[0] = (double)pcVar4[index].m_transform.m_origin.m_floats[0]
    ;
    (__return_storage_ptr__->pos).m_data[1] = (double)fVar2;
    (__return_storage_ptr__->pos).m_data[2] = (double)fVar1;
    auVar5 = vmovshdup_avx(auVar5);
    auVar6 = vmovshdup_avx(auVar6);
    (__return_storage_ptr__->rot).m_data[0] = (double)auVar6._0_4_;
    (__return_storage_ptr__->rot).m_data[1] = (double)local_30.super_cbtQuadWord.m_floats[0];
    (__return_storage_ptr__->rot).m_data[2] = (double)auVar5._0_4_;
    (__return_storage_ptr__->rot).m_data[3] = (double)local_30.super_cbtQuadWord.m_floats[2];
  }
  return __return_storage_ptr__;
}

Assistant:

ChCoordsys<> ChCollisionModelBullet::GetShapePos(int index) const {
    if (!bt_compound_shape) {
        // if not using a compound, there must be a single centered shape
        assert(m_shapes.size() == 1);
        assert(index == 0);
        return ChCoordsys<>();
    }

    ChCoordsys<> csys;
    ChBulletToCoords(bt_compound_shape->getChildTransform(index), csys);

    return csys;
}